

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_DeviceMethodResponse
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,METHOD_HANDLE methodId,uchar *response,
          size_t response_size,int status_response)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  LOGGER_LOG l_1;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  int status_response_local;
  size_t response_size_local;
  uchar *response_local;
  METHOD_HANDLE methodId_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  if ((iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) || (methodId == (METHOD_HANDLE)0x0))
  {
    l._0_4_ = IOTHUB_CLIENT_INVALID_ARG;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = IOTHUB_CLIENT_RESULTStrings(IOTHUB_CLIENT_INVALID_ARG);
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_DeviceMethodResponse",0xaa5,1,"result = %s",pcVar3);
    }
  }
  else {
    iVar1 = (*iotHubClientHandle->IoTHubTransport_DeviceMethod_Response)
                      (iotHubClientHandle->deviceHandle,methodId,response,response_size,
                       status_response);
    if (iVar1 == 0) {
      l._0_4_ = IOTHUB_CLIENT_OK;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_DeviceMethodResponse",0xaac,1,
                  "IoTHubTransport_DeviceMethod_Response failed");
      }
      l._0_4_ = IOTHUB_CLIENT_ERROR;
    }
  }
  return (IOTHUB_CLIENT_RESULT)l;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_DeviceMethodResponse(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, METHOD_HANDLE methodId, const unsigned char* response, size_t response_size, int status_response)
{
    IOTHUB_CLIENT_RESULT result;
    if (iotHubClientHandle == NULL || methodId == NULL)
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LOG_ERROR_RESULT;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        if (handleData->IoTHubTransport_DeviceMethod_Response(handleData->deviceHandle, methodId, response, response_size, status_response) != 0)
        {
            LogError("IoTHubTransport_DeviceMethod_Response failed");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }
    }
    return result;
}